

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

TIntermTyped * __thiscall
glslang::TParseContext::handleFunctionCall
          (TParseContext *this,TSourceLoc *loc,TFunction *function,TIntermNode *arguments)

{
  EShSource EVar1;
  TSymbolTable *pTVar2;
  TString name;
  TString structName;
  TIntermNode *pTVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  TOperator op;
  uint uVar7;
  int iVar8;
  TIntermConstantUnion *result;
  TPoolAllocator *pTVar9;
  TFunction *function_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long lVar10;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  long lVar11;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  long *plVar12;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  ulong uVar13;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  TType *pTVar14;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  TIntermAggregate *callNode;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  vector<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_> *this_00;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  undefined4 extraout_var_42;
  undefined4 extraout_var_43;
  undefined4 extraout_var_44;
  undefined4 extraout_var_45;
  undefined8 uVar15;
  TIntermNode **ppTVar16;
  TInfoSink *pTVar17;
  int i;
  ulong uVar18;
  TIntermediate *pTVar19;
  TIntermNode *pTVar20;
  undefined8 in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe88;
  TParseContext *this_01;
  bool builtIn;
  undefined7 uStack_16f;
  TIntermNode *arguments_local;
  TInfoSink *local_160;
  long *local_158;
  TSourceLoc *local_150;
  pool_allocator<char> local_148;
  TString local_140;
  TType type;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_80 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_58 [40];
  undefined4 extraout_var_35;
  
  arguments_local = arguments;
  if ((((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan == 0) ||
      ((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkanRelaxed != true)) ||
     (result = (TIntermConstantUnion *)vkRelaxedRemapFunctionCall(this,loc,function,arguments),
     result == (TIntermConstantUnion *)0x0)) {
    iVar6 = (*(function->super_TSymbol)._vptr_TSymbol[0x1b])(function);
    if (iVar6 == 0x1ee) {
      result = (TIntermConstantUnion *)handleLengthMethod(this,loc,function,arguments);
    }
    else {
      iVar6 = (*(function->super_TSymbol)._vptr_TSymbol[0x1b])(function);
      if (iVar6 == 0) {
        builtIn = false;
        function_00 = findFunction(this,loc,function,&builtIn);
        if (function_00 == (TFunction *)0x0) {
          result = (TIntermConstantUnion *)0x0;
        }
        else {
          if ((builtIn == true) &&
             ((iVar6 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x1b])(function_00),
              iVar6 == 0xf8 ||
              (iVar6 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x1b])(function_00),
              iVar6 == 0xf9)))) {
            iVar6 = (*(function_00->super_TSymbol)._vptr_TSymbol[3])(function_00);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                      (this,loc,1,&E_GL_EXT_shader_quad_control,
                       *(undefined8 *)(CONCAT44(extraout_var,iVar6) + 8));
          }
          if ((builtIn == true) &&
             (iVar6 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x11])(function_00), iVar6 != 0))
          {
            uVar7 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x11])(function_00);
            iVar6 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x12])(function_00);
            iVar8 = (*(function_00->super_TSymbol)._vptr_TSymbol[3])(function_00);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                      (this,loc,(ulong)uVar7,CONCAT44(extraout_var_00,iVar6),
                       *(undefined8 *)(CONCAT44(extraout_var_01,iVar8) + 8));
          }
          if (builtIn == true) {
            iVar6 = (*(function_00->super_TSymbol)._vptr_TSymbol[0xc])(function_00);
            cVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar6) + 400))
                              ((long *)CONCAT44(extraout_var_02,iVar6),3);
            if (cVar5 != '\0') {
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x15])
                        (this,loc,"built-in function",
                         "float16 types can only be in uniform block or buffer storage");
            }
          }
          if (builtIn == true) {
            iVar6 = (*(function_00->super_TSymbol)._vptr_TSymbol[0xc])(function_00);
            bVar4 = TType::contains16BitInt((TType *)CONCAT44(extraout_var_03,iVar6));
            if (bVar4) {
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x18])
                        (this,loc,"built-in function",
                         "(u)int16 types can only be in uniform block or buffer storage");
            }
          }
          if (builtIn == true) {
            iVar6 = (*(function_00->super_TSymbol)._vptr_TSymbol[0xc])(function_00);
            bVar4 = TType::contains8BitInt((TType *)CONCAT44(extraout_var_04,iVar6));
            if (bVar4) {
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x1b])
                        (this,loc,"built-in function",
                         "(u)int8 types can only be in uniform block or buffer storage");
            }
          }
          if ((builtIn == true) &&
             ((iVar6 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x1b])(function_00),
              iVar6 == 0x210 ||
              (iVar6 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x1b])(function_00),
              iVar6 == 0x207)))) {
            iVar6 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x28])(function_00,0);
            lVar10 = (**(code **)(**(long **)(CONCAT44(extraout_var_05,iVar6) + 8) + 0x48))();
            if (((*(byte *)(lVar10 + 2) & 4) != 0) &&
               ((this->super_TParseContextBase).super_TParseVersions.version < 0x8d)) {
              iVar6 = (*(function_00->super_TSymbol)._vptr_TSymbol[3])(function_00);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                        (this,loc,1,&E_GL_ARB_texture_multisample,
                         *(undefined8 *)(CONCAT44(extraout_var_06,iVar6) + 8));
            }
          }
          this_01 = this;
          if (arguments != (TIntermNode *)0x0) {
            local_150 = loc;
            iVar6 = (*arguments->_vptr_TIntermNode[6])();
            local_158 = (long *)CONCAT44(extraout_var_07,iVar6);
            pTVar17 = (TInfoSink *)0x0;
            for (uVar18 = 0;
                iVar6 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x24])(function_00),
                (long)uVar18 < (long)iVar6; uVar18 = uVar18 + 1) {
              iVar6 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x24])(function_00);
              ppTVar16 = &arguments_local;
              this = this_01;
              if ((local_158 != (long *)0x0) && (iVar6 != 1)) {
                lVar10 = (**(code **)(*local_158 + 400))();
                ppTVar16 = (TIntermNode **)
                           ((long)&(pTVar17->info).sink._M_dataplus._M_p + *(long *)(lVar10 + 8));
                this = this_01;
              }
              local_160 = pTVar17;
              pTVar20 = *ppTVar16;
              iVar6 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x28])
                                (function_00,uVar18 & 0xffffffff);
              lVar10 = (**(code **)(**(long **)(CONCAT44(extraout_var_08,iVar6) + 8) + 0x50))();
              pTVar3 = arguments_local;
              if ((*(uint *)(lVar10 + 8) & 0x7f) - 0x11 < 2) {
                iVar6 = (**arguments_local->_vptr_TIntermNode)(arguments_local);
                iVar8 = (*pTVar20->_vptr_TIntermNode[3])(pTVar20);
                iVar6 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                          [0x42])(this,CONCAT44(extraout_var_09,iVar6),"assign",
                                  CONCAT44(extraout_var_10,iVar8));
                if ((char)iVar6 != '\0') {
                  iVar6 = (**pTVar3->_vptr_TIntermNode)(pTVar3);
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,CONCAT44(extraout_var_11,iVar6),
                             "Non-L-value cannot be passed for \'out\' or \'inout\' parameters.",
                             "out","");
                }
              }
              if ((*(byte *)(lVar10 + 0xf) & 0x10) != 0) {
                iVar6 = (*pTVar20->_vptr_TIntermNode[3])(pTVar20);
                lVar11 = (**(code **)(*(long *)CONCAT44(extraout_var_12,iVar6) + 0x108))
                                   ((long *)CONCAT44(extraout_var_12,iVar6));
                if ((*(ulong *)(lVar11 + 8) & 0x10000007f) != 2) {
                  iVar6 = (**arguments_local->_vptr_TIntermNode)();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,CONCAT44(extraout_var_13,iVar6),
                             "Non front-end constant expressions cannot be passed for \'spirv_literal\' parameters."
                             ,"spirv_literal","");
                }
              }
              iVar6 = (*pTVar20->_vptr_TIntermNode[3])(pTVar20);
              plVar12 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_14,iVar6) + 0xf0))
                                          ((long *)CONCAT44(extraout_var_14,iVar6));
              lVar11 = (**(code **)(*plVar12 + 0x58))(plVar12);
              pTVar19 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
              if ((pTVar19->bindlessImageModeCaller)._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count == 0 &&
                  (pTVar19->bindlessTextureModeCaller)._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count == 0) {
                cVar5 = '\0';
              }
              else {
                cVar5 = (**(code **)(*plVar12 + 0x1b8))(plVar12);
              }
              if (((cVar5 == '\0') && ((*(ulong *)(lVar11 + 8) & 0x3ffc00000000000) != 0)) &&
                 ((cVar5 = (**(code **)(*plVar12 + 0x1b0))(plVar12), cVar5 != '\0' ||
                  (iVar6 = (**(code **)(*plVar12 + 0x38))(plVar12), iVar6 == 0x12)))) {
                uVar13 = *(ulong *)(lVar11 + 8);
                if (((uVar13 & 0x4000000000000) != 0) &&
                   ((*(ulong *)(lVar10 + 8) & 0x4000000000000) == 0)) {
                  iVar6 = (**arguments->_vptr_TIntermNode)();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,CONCAT44(extraout_var_15,iVar6),
                             "argument cannot drop memory qualifier when passed to formal parameter"
                             ,"volatile","");
                  uVar13 = *(ulong *)(lVar11 + 8);
                }
                if (((uVar13 >> 0x31 & 1) != 0) &&
                   ((*(ulong *)(lVar10 + 8) & 0x12000000000000) == 0)) {
                  iVar6 = (**arguments->_vptr_TIntermNode)();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,CONCAT44(extraout_var_16,iVar6),
                             "argument cannot drop memory qualifier when passed to formal parameter"
                             ,"coherent","");
                  uVar13 = *(ulong *)(lVar11 + 8);
                }
                if (((uVar13 >> 0x34 & 1) != 0) &&
                   ((*(ulong *)(lVar10 + 8) & 0x12000000000000) == 0)) {
                  iVar6 = (**arguments->_vptr_TIntermNode)();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,CONCAT44(extraout_var_17,iVar6),
                             "argument cannot drop memory qualifier when passed to formal parameter"
                             ,"devicecoherent","");
                  uVar13 = *(ulong *)(lVar11 + 8);
                }
                if (((uVar13 >> 0x35 & 1) != 0) && ((*(byte *)(lVar10 + 0xe) & 0x32) == 0)) {
                  iVar6 = (**arguments->_vptr_TIntermNode)();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,CONCAT44(extraout_var_18,iVar6),
                             "argument cannot drop memory qualifier when passed to formal parameter"
                             ,"queuefamilycoherent","");
                  uVar13 = *(ulong *)(lVar11 + 8);
                }
                if (((uVar13 >> 0x36 & 1) != 0) && ((*(byte *)(lVar10 + 0xe) & 0x72) == 0)) {
                  iVar6 = (**arguments->_vptr_TIntermNode)();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,CONCAT44(extraout_var_19,iVar6),
                             "argument cannot drop memory qualifier when passed to formal parameter"
                             ,"workgroupcoherent","");
                  uVar13 = *(ulong *)(lVar11 + 8);
                }
                if (((uVar13 >> 0x37 & 1) != 0) && ((*(byte *)(lVar10 + 0xe) & 0xf2) == 0)) {
                  iVar6 = (**arguments->_vptr_TIntermNode)();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,CONCAT44(extraout_var_20,iVar6),
                             "argument cannot drop memory qualifier when passed to formal parameter"
                             ,"subgroupcoherent","");
                  uVar13 = *(ulong *)(lVar11 + 8);
                }
                if (((uVar13 & 0x800000000000) != 0) &&
                   ((*(ulong *)(lVar10 + 8) & 0x800000000000) == 0)) {
                  iVar6 = (**arguments->_vptr_TIntermNode)();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,CONCAT44(extraout_var_21,iVar6),
                             "argument cannot drop memory qualifier when passed to formal parameter"
                             ,"readonly","");
                  uVar13 = *(ulong *)(lVar11 + 8);
                }
                if (((uVar13 & 0x1000000000000) != 0) &&
                   ((*(ulong *)(lVar10 + 8) & 0x1000000000000) == 0)) {
                  iVar6 = (**arguments->_vptr_TIntermNode)();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,CONCAT44(extraout_var_22,iVar6),
                             "argument cannot drop memory qualifier when passed to formal parameter"
                             ,"writeonly","");
                  uVar13 = *(ulong *)(lVar11 + 8);
                }
                if (((uVar13 & 0x8000000000000) != 0) &&
                   ((*(ulong *)(lVar10 + 8) & 0x8000000000000) == 0)) {
                  iVar6 = (**arguments->_vptr_TIntermNode)();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,CONCAT44(extraout_var_23,iVar6),
                             "argument cannot drop memory qualifier when passed to formal parameter"
                             ,"nontemporal","");
                }
              }
              this_01 = this;
              if (builtIn == false) {
                if ((*(char *)(lVar11 + 0x2c) != *(char *)(lVar10 + 0x2c)) &&
                   (((*(ulong *)(lVar10 + 8) & 0x1000000000000) == 0 ||
                    ((*(char *)(lVar11 + 0x2c) != '\0' && (*(char *)(lVar10 + 0x2c) != '\0')))))) {
                  iVar6 = (**arguments->_vptr_TIntermNode)();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,CONCAT44(extraout_var_33,iVar6),"image formats must match",
                             "format","");
                }
              }
              if ((builtIn & 1U) != 0) {
                iVar6 = (*pTVar20->_vptr_TIntermNode[3])(pTVar20);
                plVar12 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_24,iVar6) + 0xf0))
                                            ((long *)CONCAT44(extraout_var_24,iVar6));
                cVar5 = (**(code **)(*plVar12 + 400))(plVar12,3);
                if (cVar5 != '\0') {
                  iVar6 = (**arguments_local->_vptr_TIntermNode)();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x15])
                            (this,CONCAT44(extraout_var_25,iVar6),"built-in function",
                             "float16 types can only be in uniform block or buffer storage");
                }
              }
              if (builtIn == true) {
                iVar6 = (*pTVar20->_vptr_TIntermNode[3])(pTVar20);
                pTVar14 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_26,iVar6) + 0xf0))
                                             ((long *)CONCAT44(extraout_var_26,iVar6));
                bVar4 = TType::contains16BitInt(pTVar14);
                if (bVar4) {
                  iVar6 = (**arguments_local->_vptr_TIntermNode)();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x18])
                            (this,CONCAT44(extraout_var_27,iVar6),"built-in function",
                             "(u)int16 types can only be in uniform block or buffer storage");
                }
              }
              if (builtIn == true) {
                iVar6 = (*pTVar20->_vptr_TIntermNode[3])(pTVar20);
                pTVar14 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_28,iVar6) + 0xf0))
                                             ((long *)CONCAT44(extraout_var_28,iVar6));
                bVar4 = TType::contains8BitInt(pTVar14);
                if (bVar4) {
                  iVar6 = (**arguments_local->_vptr_TIntermNode)();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x1b])
                            (this,CONCAT44(extraout_var_29,iVar6),"built-in function",
                             "(u)int8 types can only be in uniform block or buffer storage");
                }
              }
              if ((builtIn == true) &&
                 (iVar6 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x1b])(function_00),
                 uVar18 == 1 && iVar6 == 0x15f)) {
                iVar6 = (*pTVar20->_vptr_TIntermNode[3])(pTVar20);
                plVar12 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_30,iVar6) + 0xf0))
                                            ((long *)CONCAT44(extraout_var_30,iVar6));
                iVar6 = (**(code **)(*plVar12 + 0x38))(plVar12);
                lVar10 = (**(code **)(*local_158 + 400))();
                plVar12 = (long *)(**(code **)(*(long *)**(undefined8 **)(lVar10 + 8) + 0x18))();
                plVar12 = (long *)(**(code **)(*plVar12 + 0xf0))(plVar12);
                iVar8 = (**(code **)(*plVar12 + 0x38))(plVar12);
                if (iVar6 != iVar8) {
                  iVar6 = (**arguments_local->_vptr_TIntermNode)();
                  iVar8 = (*(function_00->super_TSymbol)._vptr_TSymbol[3])(function_00);
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,CONCAT44(extraout_var_31,iVar6),
                             "cooperative vector basic types must match",
                             *(undefined8 *)(CONCAT44(extraout_var_32,iVar8) + 8),"");
                }
              }
              pTVar17 = (TInfoSink *)&(local_160->info).sink._M_string_length;
            }
            addInputArgumentConversions(this,function_00,&arguments_local);
            loc = local_150;
          }
          if (((builtIn == true) &&
              (iVar6 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x1b])(function_00), iVar6 != 0)
              ) || (iVar6 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x1b])(function_00),
                   pTVar20 = arguments_local, iVar6 == 7)) {
            pTVar20 = arguments_local;
            result = (TIntermConstantUnion *)
                     handleBuiltInFunctionCall(this,*loc,arguments_local,function_00);
          }
          else {
            pTVar19 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            iVar6 = (*(function_00->super_TSymbol)._vptr_TSymbol[0xc])(function_00);
            result = (TIntermConstantUnion *)
                     TIntermediate::setAggregateOperator
                               (pTVar19,pTVar20,EOpFunctionCall,
                                (TType *)CONCAT44(extraout_var_34,iVar6),loc);
            iVar6 = (*(result->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[6])(result);
            callNode = (TIntermAggregate *)CONCAT44(extraout_var_35,iVar6);
            iVar6 = (*(function_00->super_TSymbol)._vptr_TSymbol[6])(function_00);
            (*(callNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x34])(callNode,CONCAT44(extraout_var_36,iVar6));
            this = this_01;
            if (builtIn == false) {
              (*(callNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x36])(callNode);
              pTVar2 = (this_01->super_TParseContextBase).symbolTable;
              this = this_01;
              if ((int)((ulong)((long)(pTVar2->table).
                                      super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pTVar2->table).
                                     super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3) < 5) {
                TParseVersions::requireProfile
                          ((TParseVersions *)this_01,loc,-9,
                           "calling user function from global scope");
                local_160 = (this_01->super_TParseContextBase).super_TParseVersions.infoSink;
                pTVar19 = (this_01->super_TParseContextBase).super_TParseVersions.intermediate;
                local_140._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
                pTVar14 = &type;
                std::__cxx11::
                basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
                basic_string<glslang::std::allocator<char>>
                          ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                            *)pTVar14,"main(",(pool_allocator<char> *)&local_140);
              }
              else {
                local_160 = (this_01->super_TParseContextBase).super_TParseVersions.infoSink;
                pTVar19 = (this_01->super_TParseContextBase).super_TParseVersions.intermediate;
                pTVar14 = (TType *)&this_01->currentCaller;
              }
              iVar6 = (*(function_00->super_TSymbol)._vptr_TSymbol[6])(function_00);
              TIntermediate::addToCallGraph
                        (pTVar19,local_160,(TString *)pTVar14,
                         (TString *)CONCAT44(extraout_var_37,iVar6));
            }
            if (builtIn == true) {
              __assert_fail("PureOperatorBuiltins == false",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                            ,0xc60,
                            "void glslang::TParseContext::nonOpBuiltInCheck(const TSourceLoc &, const TFunction &, TIntermAggregate &)"
                           );
            }
            this_01 = this;
            userFunctionCallCheck(this,loc,callNode);
          }
          iVar6 = (*(result->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[6])(result);
          if (CONCAT44(extraout_var_38,iVar6) != 0) {
            iVar6 = (*(result->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[6])(result);
            this_00 = (vector<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>
                       *)(**(code **)(*(long *)CONCAT44(extraout_var_39,iVar6) + 0x1c0))
                                   ((long *)CONCAT44(extraout_var_39,iVar6));
            this = this_01;
            for (uVar7 = 0; iVar6 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x24])(function_00)
                , (int)uVar7 < iVar6; uVar7 = uVar7 + 1) {
              iVar6 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x28])(function_00,(ulong)uVar7);
              lVar10 = (**(code **)(**(long **)(CONCAT44(extraout_var_40,iVar6) + 8) + 0x50))();
              type._vptr_TType._0_4_ = *(uint *)(lVar10 + 8) & 0x7f;
              std::
              vector<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>
              ::push_back(this_00,(value_type *)&type);
            }
            iVar6 = (*(result->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[6])(result);
            result = (TIntermConstantUnion *)
                     addOutputArgumentConversions
                               (this,function_00,(TIntermAggregate *)CONCAT44(extraout_var_41,iVar6)
                               );
          }
          handleCoopMat2FunctionCall(this,loc,function_00,&result->super_TIntermTyped,pTVar20);
          iVar6 = (*(result->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[3])(result);
          lVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_42,iVar6) + 0xf0))
                             ((long *)CONCAT44(extraout_var_42,iVar6));
          if ((*(byte *)(lVar10 + 0xb) & 8) != 0) {
            iVar6 = (*(result->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[3])(result);
            plVar12 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_43,iVar6) + 0xf0))
                                        ((long *)CONCAT44(extraout_var_43,iVar6));
            cVar5 = (**(code **)(*plVar12 + 0x188))(plVar12);
            if (cVar5 == '\0') {
              iVar6 = (*(result->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[7])(result)
              ;
              plVar12 = (long *)CONCAT44(extraout_var_44,iVar6);
              if (plVar12 == (long *)0x0) {
                iVar6 = (*(result->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[6])
                                  (result);
                lVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_45,iVar6) + 400))
                                   ((long *)CONCAT44(extraout_var_45,iVar6));
                plVar12 = (long *)(**(code **)(*(long *)**(undefined8 **)(lVar10 + 8) + 0x18))();
              }
              else {
                plVar12 = (long *)(**(code **)(*plVar12 + 0x188))(plVar12);
                plVar12 = (long *)(**(code **)(*plVar12 + 0x18))(plVar12);
              }
              uVar15 = (**(code **)(*plVar12 + 0xf0))(plVar12);
              (*(result->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1d])
                        (result,uVar15);
            }
          }
        }
      }
      else {
        result = (TIntermConstantUnion *)0x0;
        TType::TType(&type,EbtVoid,EvqTemporary,1,0,0,false);
        op = (*(function->super_TSymbol)._vptr_TSymbol[0x1b])(function);
        pTVar20 = arguments;
        bVar4 = constructorError(this,loc,arguments,function,op,&type);
        if ((!bVar4) &&
           (result = (TIntermConstantUnion *)addConstructor(this,loc,arguments,&type),
           result == (TIntermConstantUnion *)0x0)) {
          pTVar19 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          EVar1 = pTVar19->source;
          bVar4 = pTVar19->enhancedMsgs;
          pTVar9 = GetThreadPoolAllocator();
          builtIn = SUB81(pTVar9,0);
          uStack_16f = (undefined7)((ulong)pTVar9 >> 8);
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>(local_58,"",(pool_allocator<char> *)&builtIn);
          local_148.allocator = GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>(local_80,"",&local_148);
          name._M_dataplus._M_p = (pointer)local_80;
          name._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_58;
          name._M_string_length = in_stack_fffffffffffffe78;
          name.field_2._M_allocated_capacity = (size_type)pTVar20;
          name.field_2._8_8_ = in_stack_fffffffffffffe88;
          structName._M_dataplus.super_allocator_type.allocator._1_7_ = uStack_16f;
          structName._M_dataplus.super_allocator_type.allocator._0_1_ = builtIn;
          structName._M_dataplus._M_p = (pointer)arguments_local;
          structName._M_string_length = (size_type)local_160;
          structName.field_2._M_allocated_capacity = (size_type)local_158;
          structName.field_2._8_8_ = local_150;
          TType::getCompleteString
                    (&local_140,&type,(bool)(EVar1 == EShSourceGlsl & bVar4),true,true,true,name,
                     structName);
          result = (TIntermConstantUnion *)0x0;
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"cannot construct with these arguments",local_140._M_dataplus._M_p,"")
          ;
        }
      }
    }
    if (result == (TIntermConstantUnion *)0x0) {
      result = TIntermediate::addConstantUnion
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate,0.0,
                          EbtFloat,loc,false);
    }
  }
  return &result->super_TIntermTyped;
}

Assistant:

TIntermTyped* TParseContext::handleFunctionCall(const TSourceLoc& loc, TFunction* function, TIntermNode* arguments)
{
    TIntermTyped* result = nullptr;

    if (spvVersion.vulkan != 0 && spvVersion.vulkanRelaxed) {
        // allow calls that are invalid in Vulkan Semantics to be invisibily
        // remapped to equivalent valid functions
        result = vkRelaxedRemapFunctionCall(loc, function, arguments);
        if (result)
            return result;
    }

    if (function->getBuiltInOp() == EOpArrayLength)
        result = handleLengthMethod(loc, function, arguments);
    else if (function->getBuiltInOp() != EOpNull) {
        //
        // Then this should be a constructor.
        // Don't go through the symbol table for constructors.
        // Their parameters will be verified algorithmically.
        //
        TType type(EbtVoid);  // use this to get the type back
        if (! constructorError(loc, arguments, *function, function->getBuiltInOp(), type)) {
            //
            // It's a constructor, of type 'type'.
            //
            result = addConstructor(loc, arguments, type);
            if (result == nullptr)
                error(loc, "cannot construct with these arguments", type.getCompleteString(intermediate.getEnhancedMsgs()).c_str(), "");
        }
    } else {
        //
        // Find it in the symbol table.
        //
        const TFunction* fnCandidate;
        bool builtIn {false};
        fnCandidate = findFunction(loc, *function, builtIn);
        if (fnCandidate) {
            // This is a declared function that might map to
            //  - a built-in operator,
            //  - a built-in function not mapped to an operator, or
            //  - a user function.

            // Error check for a function requiring specific extensions present.
            if (builtIn &&
                (fnCandidate->getBuiltInOp() == EOpSubgroupQuadAll || fnCandidate->getBuiltInOp() == EOpSubgroupQuadAny))
                requireExtensions(loc, 1, &E_GL_EXT_shader_quad_control, fnCandidate->getName().c_str());

            if (builtIn && fnCandidate->getNumExtensions())
                requireExtensions(loc, fnCandidate->getNumExtensions(), fnCandidate->getExtensions(), fnCandidate->getName().c_str());

            if (builtIn && fnCandidate->getType().contains16BitFloat())
                requireFloat16Arithmetic(loc, "built-in function", "float16 types can only be in uniform block or buffer storage");
            if (builtIn && fnCandidate->getType().contains16BitInt())
                requireInt16Arithmetic(loc, "built-in function", "(u)int16 types can only be in uniform block or buffer storage");
            if (builtIn && fnCandidate->getType().contains8BitInt())
                requireInt8Arithmetic(loc, "built-in function", "(u)int8 types can only be in uniform block or buffer storage");
            if (builtIn && (fnCandidate->getBuiltInOp() == EOpTextureFetch || fnCandidate->getBuiltInOp() == EOpTextureQuerySize)) {
                if ((*fnCandidate)[0].type->getSampler().isMultiSample() && version <= 140)
                    requireExtensions(loc, 1, &E_GL_ARB_texture_multisample, fnCandidate->getName().c_str());
            }
            if (arguments != nullptr) {
                // Make sure qualifications work for these arguments.
                TIntermAggregate* aggregate = arguments->getAsAggregate();
                for (int i = 0; i < fnCandidate->getParamCount(); ++i) {
                    // At this early point there is a slight ambiguity between whether an aggregate 'arguments'
                    // is the single argument itself or its children are the arguments.  Only one argument
                    // means take 'arguments' itself as the one argument.
                    TIntermNode* arg = fnCandidate->getParamCount() == 1 ? arguments : (aggregate ? aggregate->getSequence()[i] : arguments);
                    TQualifier& formalQualifier = (*fnCandidate)[i].type->getQualifier();
                    if (formalQualifier.isParamOutput()) {
                        if (lValueErrorCheck(arguments->getLoc(), "assign", arg->getAsTyped()))
                            error(arguments->getLoc(), "Non-L-value cannot be passed for 'out' or 'inout' parameters.", "out", "");
                    }
                    if (formalQualifier.isSpirvLiteral()) {
                        if (!arg->getAsTyped()->getQualifier().isFrontEndConstant()) {
                            error(arguments->getLoc(),
                                  "Non front-end constant expressions cannot be passed for 'spirv_literal' parameters.",
                                  "spirv_literal", "");
                        }
                    }
                    const TType& argType = arg->getAsTyped()->getType();
                    const TQualifier& argQualifier = argType.getQualifier();
                    bool containsBindlessSampler = intermediate.getBindlessMode() && argType.containsSampler();
                    if (argQualifier.isMemory() && !containsBindlessSampler && (argType.containsOpaque() || argType.isReference())) {
                        const char* message = "argument cannot drop memory qualifier when passed to formal parameter";
                        if (argQualifier.volatil && ! formalQualifier.volatil)
                            error(arguments->getLoc(), message, "volatile", "");
                        if (argQualifier.coherent && ! (formalQualifier.devicecoherent || formalQualifier.coherent))
                            error(arguments->getLoc(), message, "coherent", "");
                        if (argQualifier.devicecoherent && ! (formalQualifier.devicecoherent || formalQualifier.coherent))
                            error(arguments->getLoc(), message, "devicecoherent", "");
                        if (argQualifier.queuefamilycoherent && ! (formalQualifier.queuefamilycoherent || formalQualifier.devicecoherent || formalQualifier.coherent))
                            error(arguments->getLoc(), message, "queuefamilycoherent", "");
                        if (argQualifier.workgroupcoherent && ! (formalQualifier.workgroupcoherent || formalQualifier.queuefamilycoherent || formalQualifier.devicecoherent || formalQualifier.coherent))
                            error(arguments->getLoc(), message, "workgroupcoherent", "");
                        if (argQualifier.subgroupcoherent && ! (formalQualifier.subgroupcoherent || formalQualifier.workgroupcoherent || formalQualifier.queuefamilycoherent || formalQualifier.devicecoherent || formalQualifier.coherent))
                            error(arguments->getLoc(), message, "subgroupcoherent", "");
                        if (argQualifier.readonly && ! formalQualifier.readonly)
                            error(arguments->getLoc(), message, "readonly", "");
                        if (argQualifier.writeonly && ! formalQualifier.writeonly)
                            error(arguments->getLoc(), message, "writeonly", "");
                        if (argQualifier.nontemporal && ! formalQualifier.nontemporal)
                            error(arguments->getLoc(), message, "nontemporal", "");
                        // Don't check 'restrict', it is different than the rest:
                        // "...but only restrict can be taken away from a calling argument, by a formal parameter that
                        // lacks the restrict qualifier..."
                    }
                    if (!builtIn && argQualifier.getFormat() != formalQualifier.getFormat()) {
                        // we have mismatched formats, which should only be allowed if writeonly
                        // and at least one format is unknown
                        if (!formalQualifier.isWriteOnly() || (formalQualifier.getFormat() != ElfNone &&
                                                                  argQualifier.getFormat() != ElfNone))
                            error(arguments->getLoc(), "image formats must match", "format", "");
                    }
                    if (builtIn && arg->getAsTyped()->getType().contains16BitFloat())
                        requireFloat16Arithmetic(arguments->getLoc(), "built-in function", "float16 types can only be in uniform block or buffer storage");
                    if (builtIn && arg->getAsTyped()->getType().contains16BitInt())
                        requireInt16Arithmetic(arguments->getLoc(), "built-in function", "(u)int16 types can only be in uniform block or buffer storage");
                    if (builtIn && arg->getAsTyped()->getType().contains8BitInt())
                        requireInt8Arithmetic(arguments->getLoc(), "built-in function", "(u)int8 types can only be in uniform block or buffer storage");

                    // Check that coopVecOuterProductAccumulateNV vector component types match
                    if (builtIn && fnCandidate->getBuiltInOp() == EOpCooperativeVectorOuterProductAccumulateNV &&
                        i == 1 && arg->getAsTyped()->getType().getBasicType() != aggregate->getSequence()[0]->getAsTyped()->getType().getBasicType())
                        error(arguments->getLoc(), "cooperative vector basic types must match", fnCandidate->getName().c_str(), "");

                    // TODO 4.5 functionality:  A shader will fail to compile
                    // if the value passed to the memargument of an atomic memory function does not correspond to a buffer or
                    // shared variable. It is acceptable to pass an element of an array or a single component of a vector to the
                    // memargument of an atomic memory function, as long as the underlying array or vector is a buffer or
                    // shared variable.
                }

                // Convert 'in' arguments
                addInputArgumentConversions(*fnCandidate, arguments);  // arguments may be modified if it's just a single argument node
            }

            if (builtIn && fnCandidate->getBuiltInOp() != EOpNull) {
                // A function call mapped to a built-in operation.
                result = handleBuiltInFunctionCall(loc, arguments, *fnCandidate);
            } else if (fnCandidate->getBuiltInOp() == EOpSpirvInst) {
                // When SPIR-V instruction qualifier is specified, the function call is still mapped to a built-in operation.
                result = handleBuiltInFunctionCall(loc, arguments, *fnCandidate);
            } else {
                // This is a function call not mapped to built-in operator.
                // It could still be a built-in function, but only if PureOperatorBuiltins == false.
                result = intermediate.setAggregateOperator(arguments, EOpFunctionCall, fnCandidate->getType(), loc);
                TIntermAggregate* call = result->getAsAggregate();
                call->setName(fnCandidate->getMangledName());

                // this is how we know whether the given function is a built-in function or a user-defined function
                // if builtIn == false, it's a userDefined -> could be an overloaded built-in function also
                // if builtIn == true, it's definitely a built-in function with EOpNull
                if (! builtIn) {
                    call->setUserDefined();
                    if (symbolTable.atGlobalLevel()) {
                        requireProfile(loc, ~EEsProfile, "calling user function from global scope");
                        intermediate.addToCallGraph(infoSink, "main(", fnCandidate->getMangledName());
                    } else
                        intermediate.addToCallGraph(infoSink, currentCaller, fnCandidate->getMangledName());
                }

                if (builtIn)
                    nonOpBuiltInCheck(loc, *fnCandidate, *call);
                else
                    userFunctionCallCheck(loc, *call);
            }

            // Convert 'out' arguments.  If it was a constant folded built-in, it won't be an aggregate anymore.
            // Built-ins with a single argument aren't called with an aggregate, but they also don't have an output.
            // Also, build the qualifier list for user function calls, which are always called with an aggregate.
            if (result->getAsAggregate()) {
                TQualifierList& qualifierList = result->getAsAggregate()->getQualifierList();
                for (int i = 0; i < fnCandidate->getParamCount(); ++i) {
                    TStorageQualifier qual = (*fnCandidate)[i].type->getQualifier().storage;
                    qualifierList.push_back(qual);
                }
                result = addOutputArgumentConversions(*fnCandidate, *result->getAsAggregate());
            }

            handleCoopMat2FunctionCall(loc, fnCandidate, result, arguments);

            if (result->getAsTyped()->getType().isCoopVecNV() &&
               !result->getAsTyped()->getType().isParameterized()) {
                if (auto unaryNode = result->getAsUnaryNode())
                    result->setType(unaryNode->getOperand()->getAsTyped()->getType());
                else
                    result->setType(result->getAsAggregate()->getSequence()[0]->getAsTyped()->getType());
            }
        }
    }

    // generic error recovery
    // TODO: simplification: localize all the error recoveries that look like this, and taking type into account to reduce cascades
    if (result == nullptr)
        result = intermediate.addConstantUnion(0.0, EbtFloat, loc);

    return result;
}